

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O1

int __thiscall CChat::NextActiveCommand(CChat *this,int *pIndex)

{
  int iVar1;
  bool *pbVar2;
  int iVar3;
  
  pbVar2 = (this->m_aFilter).list;
  do {
    iVar1 = *pIndex;
    iVar3 = (int)((long)iVar1 + 1);
    *pIndex = iVar3;
    if ((this->m_aFilter).num_elements <= iVar3) {
      return iVar3;
    }
  } while (pbVar2[(long)iVar1 + 1] != false);
  return iVar3;
}

Assistant:

int CChat::NextActiveCommand(int *pIndex)
{
	(*pIndex)++;
	while(*pIndex < m_aFilter.size() && m_aFilter[*pIndex])
		(*pIndex)++;
	return *pIndex;
}